

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cc
# Opt level: O2

void __thiscall Image::Blit(Image *this,Image *src,int x,int y)

{
  pointer pcVar1;
  pointer pcVar2;
  color_t cVar3;
  int iVar4;
  int yy;
  int y_00;
  int xx;
  int x_00;
  
  for (y_00 = 0; y_00 < src->height_; y_00 = y_00 + 1) {
    for (x_00 = 0; x_00 < src->width_; x_00 = x_00 + 1) {
      cVar3 = Get(src,x_00,y_00);
      iVar4 = this->width_ * y + x + x_00;
      pcVar2 = (this->pixels_).super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar1 = pcVar2 + iVar4;
      pcVar1->r = (char)cVar3._0_2_;
      pcVar1->g = (char)((ushort)cVar3._0_2_ >> 8);
      pcVar2[iVar4].b = cVar3.b;
    }
    y = y + 1;
  }
  return;
}

Assistant:

void Image::Blit(Image const& src, int x, int y) {
  for (auto yy = 0; yy < src.GetHeight(); ++yy) {
    for (auto xx = 0; xx < src.GetWidth(); ++xx) {
      Set(xx + x, yy + y, src.Get(xx, yy));
    }
  }
}